

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const(&)[29],unsigned_int,char_const(&)[2],char_const&,char_const(&)[20],unsigned_int&,char_const(&)[3]>
          (CompilerGLSL *this,char (*t) [29],uint *ts,char (*ts_1) [2],char *ts_2,char (*ts_3) [20],
          uint *ts_4,char (*ts_5) [3])

{
  char (*ts_local_3) [20];
  char *ts_local_2;
  char (*ts_local_1) [2];
  uint *ts_local;
  char (*t_local) [29];
  CompilerGLSL *this_local;
  
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,*t);
  this->statement_count = this->statement_count + 1;
  statement_inner<unsigned_int,char_const(&)[2],char_const&,char_const(&)[20],unsigned_int&,char_const(&)[3]>
            (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}